

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScript.c
# Opt level: O1

void Gia_ManPerformFlow(int fIsMapped,int nAnds,int nLevels,int nLutSize,int nCutNum,int fMinAve,
                       int fUseMfs,int fVerbose)

{
  Abc_Frame_t *pAVar1;
  int extraout_EDX;
  int nLevels_00;
  
  if (fIsMapped != 0) {
    pAVar1 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar1,"&st");
    fIsMapped = (int)pAVar1;
    nLevels = extraout_EDX;
  }
  Gia_ManPerformRound(fIsMapped,nAnds,nLevels,nLutSize,nCutNum,fMinAve,fUseMfs,fVerbose);
  pAVar1 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar1,"&st; &sopb");
  Gia_ManPerformRound((int)pAVar1,nAnds,nLevels_00,nLutSize,nCutNum,fMinAve,fUseMfs,fVerbose);
  return;
}

Assistant:

void Gia_ManPerformFlow( int fIsMapped, int nAnds, int nLevels, int nLutSize, int nCutNum, int fMinAve, int fUseMfs, int fVerbose )
{
	// remove comb equivs
	if ( fIsMapped )
	    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&st" );
//	if ( Abc_FrameReadGia(Abc_FrameGetGlobalFrame())->pManTime )
//		Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&sweep" );
//	else
//		Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&fraig -c" );

	// perform first round
	Gia_ManPerformRound( fIsMapped, nAnds, nLevels, nLutSize, nCutNum, fMinAve, fUseMfs, fVerbose );

	// perform synthesis
	Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&st; &sopb" );

	// perform first round
	Gia_ManPerformRound( fIsMapped, nAnds, nLevels, nLutSize, nCutNum, fMinAve, fUseMfs, fVerbose );
}